

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O0

timestamp_t
duckdb::DateTrunc::UnaryFunction<duckdb::date_t,duckdb::timestamp_t,duckdb::DateTrunc::DayOperator>
          (date_t input)

{
  bool bVar1;
  timestamp_t tVar2;
  date_t in_EDI;
  date_t in_stack_0000002c;
  undefined8 in_stack_fffffffffffffff8;
  date_t input_00;
  
  input_00.days = (int32_t)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  bVar1 = duckdb::Value::IsFinite<duckdb::date_t>(in_EDI);
  if (bVar1) {
    tVar2 = DayOperator::Operation<duckdb::date_t,duckdb::timestamp_t>(input_00);
  }
  else {
    tVar2 = Cast::Operation<duckdb::date_t,duckdb::timestamp_t>(in_stack_0000002c);
  }
  return (timestamp_t)tVar2.value;
}

Assistant:

static inline TR UnaryFunction(TA input) {
		if (Value::IsFinite(input)) {
			return OP::template Operation<TA, TR>(input);
		} else {
			return Cast::template Operation<TA, TR>(input);
		}
	}